

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChDirectSolverLS.cpp
# Opt level: O3

void __thiscall
chrono::ChDirectSolverLS::WriteMatrix(ChDirectSolverLS *this,string *filename,ChSparseMatrix *M)

{
  long lVar1;
  StorageIndex *pSVar2;
  StorageIndex *pSVar3;
  ChStreamOutAscii *pCVar4;
  long lVar5;
  long lVar6;
  Index IVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  StorageIndex SVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ChStreamOutAsciiFile file;
  double local_328;
  ChStreamOutAsciiFile local_320;
  
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&local_320,(filename->_M_dataplus)._M_p,_S_trunc);
  builtin_strncpy(local_320.super_ChStreamOutAscii.number_format,"%.12g",6);
  IVar7 = M->m_outerSize;
  if (0 < IVar7) {
    lVar5 = M->m_innerSize;
    lVar6 = lVar5;
    lVar15 = 0;
    do {
      lVar1 = lVar15 + 1;
      if (0 < lVar6) {
        uVar8 = 0;
        do {
          if (M->m_outerSize <= lVar15) {
            __assert_fail("row>=0 && row<rows() && col>=0 && col<cols()",
                          "/usr/include/eigen3/Eigen/src/SparseCore/SparseMatrix.h",0xc0,
                          "Scalar Eigen::SparseMatrix<double, 1>::coeff(Index, Index) const [_Scalar = double, _Options = 1, _StorageIndex = int]"
                         );
          }
          pSVar2 = M->m_outerIndex;
          if (M->m_innerNonZeros == (StorageIndex *)0x0) {
            iVar9 = pSVar2[lVar15];
            SVar11 = pSVar2[lVar15 + 1];
          }
          else {
            iVar9 = pSVar2[lVar15];
            SVar11 = M->m_innerNonZeros[lVar15] + iVar9;
          }
          local_328 = 0.0;
          if (iVar9 < SVar11) {
            lVar12 = (long)SVar11;
            pSVar3 = (M->m_data).m_indices;
            lVar14 = lVar12 + -1;
            if (uVar8 != (uint)pSVar3[lVar12 + -1]) {
              lVar10 = (long)iVar9;
              while (lVar13 = lVar14, lVar10 < lVar13) {
                lVar14 = lVar13 + lVar10 >> 1;
                if ((long)pSVar3[lVar14] < (long)uVar8) {
                  lVar10 = lVar14 + 1;
                  lVar14 = lVar13;
                }
              }
              if ((lVar12 <= lVar10) || (lVar14 = lVar10, uVar8 != (uint)pSVar3[lVar10]))
              goto LAB_00798d52;
            }
            local_328 = (M->m_data).m_values[lVar14];
            if ((local_328 == 0.0) && (!NAN(local_328))) goto LAB_00798d52;
LAB_00798d62:
            pCVar4 = ChStreamOutAscii::operator<<(&local_320.super_ChStreamOutAscii,(int)lVar1);
            pCVar4 = ChStreamOutAscii::operator<<(pCVar4," ");
            pCVar4 = ChStreamOutAscii::operator<<(pCVar4,(int)uVar8 + 1);
            pCVar4 = ChStreamOutAscii::operator<<(pCVar4," ");
            pCVar4 = ChStreamOutAscii::operator<<(pCVar4,local_328);
            ChStreamOutAscii::operator<<(pCVar4,"\n");
            lVar5 = M->m_innerSize;
          }
          else {
LAB_00798d52:
            if ((M->m_outerSize + -1 == lVar15) && (lVar6 - 1U == uVar8)) goto LAB_00798d62;
          }
          uVar8 = uVar8 + 1;
          lVar6 = lVar5;
        } while ((long)uVar8 < lVar5);
        IVar7 = M->m_outerSize;
      }
      lVar15 = lVar1;
    } while (lVar1 < IVar7);
  }
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&local_320);
  return;
}

Assistant:

void ChDirectSolverLS::WriteMatrix(const std::string& filename, const ChSparseMatrix& M) {
    ChStreamOutAsciiFile file(filename.c_str());
    file.SetNumFormat("%.12g");
    for (int i = 0; i < M.rows(); i++) {
        for (int j = 0; j < M.cols(); j++) {
            double elVal = M.coeff(i, j);
            if (elVal || (i == M.rows() - 1 && j == M.cols() - 1)) {
                file << i + 1 << " " << j + 1 << " " << elVal << "\n";
            }
        }
    }
}